

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  FILE *pFVar4;
  ostream *poVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  char cVar8;
  FilePath output_file_path;
  FilePath output_dir;
  GTestLog local_5c;
  FilePath local_58;
  FilePath local_38;
  
  paVar1 = &local_58.pathname_.field_2;
  pcVar2 = (output_file->_M_dataplus)._M_p;
  local_58.pathname_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + output_file->_M_string_length);
  _Var6._M_p = local_58.pathname_._M_dataplus._M_p;
  if (local_58.pathname_._M_string_length != 0) {
    sVar7 = 0;
    do {
      cVar8 = local_58.pathname_._M_dataplus._M_p[sVar7];
      if (((cVar8 != '/') || (cVar8 = '/', _Var6._M_p == local_58.pathname_._M_dataplus._M_p)) ||
         (_Var6._M_p[-1] != '/')) {
        *_Var6._M_p = cVar8;
        _Var6._M_p = _Var6._M_p + 1;
      }
      sVar7 = sVar7 + 1;
    } while (local_58.pathname_._M_string_length != sVar7);
  }
  local_58.pathname_._M_string_length = (long)_Var6._M_p - (long)local_58.pathname_._M_dataplus._M_p
  ;
  *_Var6._M_p = '\0';
  FilePath::RemoveFileName(&local_38,&local_58);
  bVar3 = FilePath::CreateDirectoriesRecursively(&local_38);
  if (bVar3) {
    pFVar4 = fopen((output_file->_M_dataplus)._M_p,"w");
  }
  else {
    pFVar4 = (FILE *)0x0;
  }
  if (pFVar4 == (FILE *)0x0) {
    GTestLog::GTestLog(&local_5c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/build_O1/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0xbe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to open file \"",0x15);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(output_file->_M_dataplus)._M_p,
                        output_file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    GTestLog::~GTestLog(&local_5c);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.pathname_._M_dataplus._M_p != &local_38.pathname_.field_2) {
    operator_delete(local_38.pathname_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.pathname_._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.pathname_._M_dataplus._M_p);
  }
  return (FILE *)pFVar4;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = nullptr;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == nullptr) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}